

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_sysprof.c
# Opt level: O2

int lj_sysprof_set_writer(luam_Sysprof_writer writer)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  if ((writer != (luam_Sysprof_writer)0x0) && (sysprof.state == 0)) {
    sysprof.writer = writer;
    iVar1 = is_unconfigured((sysprof *)writer);
    iVar2 = 0;
    if (iVar1 == 0) {
      sysprof.state = 0;
      return 0;
    }
  }
  return iVar2;
}

Assistant:

int lj_sysprof_set_writer(luam_Sysprof_writer writer) {
  struct sysprof *sp = &sysprof;

  if (sp->state != SPS_IDLE || writer == NULL)
    return PROFILE_ERRUSE;

  sp->writer = writer;
  if (!is_unconfigured(sp)) {
    sp->state = SPS_IDLE;
  }
  return PROFILE_SUCCESS;
}